

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

int cdef_filter_block_worker_hook(void *arg1,void *arg2)

{
  uint uVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  CdefSearchCtx *cdef_search_ctx;
  CommonModeInfoParams *pCVar3;
  MB_MODE_INFO **ppMVar4;
  MB_MODE_INFO *pMVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  ulong uVar14;
  MB_MODE_INFO **ppMVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  int sb_count;
  int cur_fbc;
  int cur_fbr;
  
  __mutex = *arg2;
  cdef_search_ctx = *(CdefSearchCtx **)(*arg1 + 0x42c28);
  iVar7 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar7 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    pthread_mutex_lock(*arg2);
    if (*(char *)((long)arg2 + 0x1c) == '\0') {
      do {
        uVar1 = cdef_search_ctx->nvfb;
        uVar9 = cdef_search_ctx->nhfb;
        if (*(int *)((long)arg2 + 0x10) == 0) {
          pCVar3 = cdef_search_ctx->mi_params;
          ppMVar4 = pCVar3->mi_grid_base;
          iVar7 = pCVar3->mi_stride;
          iVar2 = pCVar3->mi_rows;
          uVar17 = *(uint *)((long)arg2 + 0x14);
          uVar19 = *(uint *)((long)arg2 + 0x18);
          bVar6 = false;
          do {
            lVar18 = (long)(int)uVar17 * 0x10 * (long)iVar7;
            iVar10 = iVar2 - (int)((long)(int)uVar17 * 0x10);
            iVar12 = 0x10;
            if (iVar10 < 0x10) {
              iVar12 = iVar10;
            }
            bVar13 = iVar10 < 1;
            if (0 < iVar10) {
              uVar8 = pCVar3->mi_cols + uVar19 * -0x10;
              uVar11 = 0x10;
              if ((int)uVar8 < 0x10) {
                uVar11 = uVar8;
              }
              ppMVar15 = ppMVar4 + lVar18 + (int)(uVar19 * 0x10);
              if ((int)uVar11 < 2) {
                uVar11 = 1;
              }
              iVar10 = 1;
              if (1 < iVar12) {
                iVar10 = iVar12;
              }
              iVar16 = 0;
              bVar13 = false;
              do {
                if (0 < (int)uVar8) {
                  uVar14 = 0;
                  do {
                    if (ppMVar15[uVar14]->skip_txfm == '\0') goto LAB_002ef809;
                    uVar14 = uVar14 + 1;
                  } while (uVar11 != uVar14);
                }
                iVar16 = iVar16 + 1;
                bVar13 = iVar12 <= iVar16;
                ppMVar15 = ppMVar15 + iVar7;
              } while (iVar16 != iVar10);
            }
LAB_002ef809:
            if (((!bVar13) &&
                ((pMVar5 = ppMVar4[(int)((int)lVar18 + uVar19 * 0x10)], (uVar19 & 1) == 0 ||
                 ((pMVar5->bsize & ~BLOCK_4X8) != BLOCK_128X64)))) &&
               (((uVar17 & 1) == 0 || ((pMVar5->bsize - BLOCK_64X128 & 0xfd) != 0)))) break;
            uVar19 = uVar19 + 1;
            *(uint *)((long)arg2 + 0x18) = uVar19;
            if (uVar19 == uVar9) {
              uVar17 = uVar17 + 1;
              *(uint *)((long)arg2 + 0x14) = uVar17;
              if (uVar17 == uVar1) {
                *(undefined4 *)((long)arg2 + 0x10) = 1;
                bVar6 = true;
              }
              else {
                *(undefined4 *)((long)arg2 + 0x18) = 0;
                uVar19 = 0;
              }
            }
          } while (!bVar6);
        }
        if (*(int *)((long)arg2 + 0x10) != 0) break;
        iVar7 = *(int *)((long)arg2 + 0x14);
        iVar2 = *(int *)((long)arg2 + 0x18);
        iVar12 = cdef_search_ctx->sb_count;
        cdef_search_ctx->sb_count = iVar12 + 1;
        uVar17 = iVar2 + 1;
        *(uint *)((long)arg2 + 0x18) = uVar17;
        if (uVar17 == uVar9) {
          uVar9 = iVar7 + 1;
          *(uint *)((long)arg2 + 0x14) = uVar9;
          if (uVar9 == uVar1) {
            *(undefined4 *)((long)arg2 + 0x10) = 1;
          }
          else {
            *(undefined4 *)((long)arg2 + 0x18) = 0;
          }
        }
        pthread_mutex_unlock(*arg2);
        av1_cdef_mse_calc_block
                  (cdef_search_ctx,(aom_internal_error_info *)((long)arg1 + 0x18),iVar7,iVar2,iVar12
                  );
        pthread_mutex_lock(*arg2);
      } while (*(char *)((long)arg2 + 0x1c) != '\x01');
    }
    pthread_mutex_unlock(*arg2);
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar7 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg2 + 0x1c) = 1;
    pthread_mutex_unlock(__mutex);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int cdef_filter_block_worker_hook(void *arg1, void *arg2) {
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1CdefSync *const cdef_sync = (AV1CdefSync *)arg2;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *cdef_mutex_ = cdef_sync->mutex_;
#endif
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  CdefSearchCtx *cdef_search_ctx = thread_data->cpi->cdef_search_ctx;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(cdef_mutex_);
    cdef_sync->cdef_mt_exit = true;
    pthread_mutex_unlock(cdef_mutex_);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  volatile int cur_fbr, cur_fbc, sb_count;
  while (cdef_get_next_job(cdef_sync, cdef_search_ctx, &cur_fbr, &cur_fbc,
                           &sb_count)) {
    av1_cdef_mse_calc_block(cdef_search_ctx, error_info, cur_fbr, cur_fbc,
                            sb_count);
  }
  error_info->setjmp = 0;
  return 1;
}